

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionFreeStr.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionFreeStr::write_cpp
          (InstructionFreeStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  allocator local_62;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string(local_40,"data",&local_61);
  std::__cxx11::string::string(local_60,"buf",&local_62);
  (*(this->super_Instruction)._vptr_Instruction[0x14])(this,ss,es,cpp_emitter,local_40,local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionFreeStr::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    write_cpp_code_seq( ss, es, cpp_emitter );
    write_trans( ss, cpp_emitter );
}